

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k)

{
  opj_tcp_t *poVar1;
  opj_tile_info_t *poVar2;
  int iVar3;
  int *piVar4;
  opj_pi_iterator_t *pi;
  opj_tp_info_t *poVar5;
  long lVar6;
  int iVar7;
  int tileno;
  int pino;
  int iVar8;
  
  lVar6 = (long)cp->th * (long)cp->tw;
  piVar4 = (int *)malloc(lVar6 * 4);
  j2k->cur_totnum_tp = piVar4;
  if ((int)lVar6 < 1) {
    iVar7 = 0;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      poVar1 = cp->tcps;
      if (poVar1[lVar6].numpocs < 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        pino = -1;
        do {
          tileno = (int)lVar6;
          pi = pi_initialise_encode(image,cp,tileno,FINAL_PASS);
          if (pi == (opj_pi_iterator_t *)0x0) {
            return -1;
          }
          pino = pino + 1;
          iVar3 = j2k_get_num_tp(cp,pino,tileno);
          iVar7 = iVar7 + iVar3;
          iVar8 = iVar8 + iVar3;
          pi_destroy(pi,cp,tileno);
        } while (pino < poVar1[lVar6].numpocs);
        piVar4 = j2k->cur_totnum_tp;
      }
      piVar4[lVar6] = iVar8;
      if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
        poVar2 = j2k->cstr_info->tile;
        poVar2[lVar6].num_tps = iVar8;
        poVar5 = (opj_tp_info_t *)malloc((long)iVar8 * 0x14);
        poVar2[lVar6].tp = poVar5;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)cp->th * (long)cp->tw);
  }
  return iVar7;
}

Assistant:

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k ){
	int pino,tileno,totnum_tp=0;

	OPJ_ARG_NOT_USED(img_numcomp);

	j2k->cur_totnum_tp = (int *) opj_malloc(cp->tw * cp->th * sizeof(int));
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int cur_totnum_tp = 0;
		opj_tcp_t *tcp = &cp->tcps[tileno];
		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tp_num=0;
			opj_pi_iterator_t *pi = pi_initialise_encode(image, cp, tileno,FINAL_PASS);
			if(!pi) { return -1;}
			tp_num = j2k_get_num_tp(cp,pino,tileno);
			totnum_tp = totnum_tp + tp_num;
			cur_totnum_tp = cur_totnum_tp + tp_num;
			pi_destroy(pi, cp, tileno);
		}
		j2k->cur_totnum_tp[tileno] = cur_totnum_tp;
		/* INDEX >> */
		if (j2k->cstr_info) {
			j2k->cstr_info->tile[tileno].num_tps = cur_totnum_tp;
			j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_malloc(cur_totnum_tp * sizeof(opj_tp_info_t));
		}
		/* << INDEX */
	}
	return totnum_tp;
}